

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdInParse.cpp
# Opt level: O2

void usage(void)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "\nUsage:\n    StdInParse [options] < <XML file>\n\nThis program demonstrates streaming XML data from standard\ninput.  It then uses the SAX Parser, and prints the\nnumber of elements, attributes, spaces and characters found\nin the input, using SAX API.\n\nOptions:\n    -v=xxx      Validation scheme [always | never | auto*].\n    -n          Enable namespace processing. Defaults to off.\n    -s          Enable schema processing. Defaults to off.\n    -f          Enable full schema constraint checking. Defaults to off.\n    -?          Show this help.\n\n  * = Default if not provided explicitly.\n"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void usage()
{
    std::cout << "\nUsage:\n"
            "    StdInParse [options] < <XML file>\n\n"
            "This program demonstrates streaming XML data from standard\n"
            "input.  It then uses the SAX Parser, and prints the\n"
            "number of elements, attributes, spaces and characters found\n"
            "in the input, using SAX API.\n\n"
            "Options:\n"
            "    -v=xxx      Validation scheme [always | never | auto*].\n"
            "    -n          Enable namespace processing. Defaults to off.\n"
            "    -s          Enable schema processing. Defaults to off.\n"
            "    -f          Enable full schema constraint checking. Defaults to off.\n"
		      "    -?          Show this help.\n\n"
            "  * = Default if not provided explicitly.\n"
         << std::endl;
}